

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_free.c
# Opt level: O2

void lysp_when_free(lysf_ctx *ctx,lysp_when *when)

{
  lysp_ext_instance *plVar1;
  lysp_ext_instance *plVar2;
  long lVar3;
  
  lydict_remove(ctx->ctx,when->cond);
  lydict_remove(ctx->ctx,when->dsc);
  lydict_remove(ctx->ctx,when->ref);
  lVar3 = 0;
  plVar2 = (lysp_ext_instance *)0x0;
  while( true ) {
    plVar1 = when->exts;
    if (plVar1 == (lysp_ext_instance *)0x0) {
      return;
    }
    if (plVar1[-1].exts <= plVar2) break;
    lysp_ext_instance_free(ctx,(lysp_ext_instance *)((long)&plVar1->name + lVar3));
    plVar2 = (lysp_ext_instance *)((long)&plVar2->name + 1);
    lVar3 = lVar3 + 0x70;
  }
  free(&plVar1[-1].exts);
  return;
}

Assistant:

void
lysp_when_free(struct lysf_ctx *ctx, struct lysp_when *when)
{
    lydict_remove(ctx->ctx, when->cond);
    lydict_remove(ctx->ctx, when->dsc);
    lydict_remove(ctx->ctx, when->ref);
    FREE_ARRAY(ctx, when->exts, lysp_ext_instance_free);
}